

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::FindPairing
          (UnorderedElementsAreMatcherImplBase *this,MatchMatrix *matrix,
          MatchResultListener *listener)

{
  MatchResultListener *pMVar1;
  bool bVar2;
  size_t mi;
  ulong uVar3;
  long lVar4;
  char *sep;
  size_t max_flow;
  ElementMatcherPairs matches;
  
  FindMaxBipartiteMatching(&matches,matrix);
  max_flow = (long)matches.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)matches.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (((*(uint *)this & 1) == 0) || (*(ulong *)(matrix + 8) <= max_flow)) {
    if (((*(uint *)this & 2) == 0) || (*(ulong *)matrix <= max_flow)) {
      if ((1 < max_flow) && (listener->stream_ != (ostream *)0x0)) {
        sep = "where:\n";
        lVar4 = 8;
        for (uVar3 = 0;
            uVar3 < (ulong)((long)matches.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)matches.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1
            ) {
          pMVar1 = MatchResultListener::operator<<(listener,&sep);
          pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [13])" - element #");
          pMVar1 = MatchResultListener::operator<<
                             (pMVar1,(unsigned_long *)
                                     ((long)matches.
                                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8))
          ;
          pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [25])" is matched by matcher #")
          ;
          MatchResultListener::operator<<
                    (pMVar1,(unsigned_long *)
                            ((long)&(matches.
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar4));
          sep = ",\n";
          lVar4 = lVar4 + 0x10;
        }
      }
      bVar2 = true;
      goto LAB_0020768e;
    }
    if (listener->stream_ != (ostream *)0x0) {
      pMVar1 = MatchResultListener::operator<<
                         (listener,(char (*) [65])
                                   "where not all elements can be matched, and the closest match is "
                         );
      pMVar1 = MatchResultListener::operator<<(pMVar1,&max_flow);
      pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [5])0x2554f5);
      sep = *(char **)(matrix + 8);
      pMVar1 = MatchResultListener::operator<<(pMVar1,(unsigned_long *)&sep);
      MatchResultListener::operator<<(pMVar1,(char (*) [30])" matchers with the pairings:\n");
      goto LAB_002075ce;
    }
  }
  else if (listener->stream_ != (ostream *)0x0) {
    pMVar1 = MatchResultListener::operator<<
                       (listener,(char (*) [89])
                                 "where no permutation of the elements can satisfy all matchers, and the closest match is "
                       );
    pMVar1 = MatchResultListener::operator<<(pMVar1,&max_flow);
    pMVar1 = MatchResultListener::operator<<(pMVar1,(char (*) [5])0x2554f5);
    sep = *(char **)(matrix + 8);
    pMVar1 = MatchResultListener::operator<<(pMVar1,(unsigned_long *)&sep);
    MatchResultListener::operator<<(pMVar1,(char (*) [30])" matchers with the pairings:\n");
LAB_002075ce:
    LogElementMatcherPairVec(&matches,listener->stream_);
  }
  bVar2 = false;
LAB_0020768e:
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&matches.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  return bVar2;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::FindPairing(
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  ElementMatcherPairs matches = FindMaxBipartiteMatching(matrix);

  size_t max_flow = matches.size();
  if ((match_flags() & UnorderedMatcherRequire::Superset) &&
      max_flow < matrix.RhsSize()) {
    if (listener->IsInterested()) {
      *listener << "where no permutation of the elements can satisfy all "
                   "matchers, and the closest match is "
                << max_flow << " of " << matrix.RhsSize()
                << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }
  if ((match_flags() & UnorderedMatcherRequire::Subset) &&
      max_flow < matrix.LhsSize()) {
    if (listener->IsInterested()) {
      *listener
          << "where not all elements can be matched, and the closest match is "
          << max_flow << " of " << matrix.RhsSize()
          << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }

  if (matches.size() > 1) {
    if (listener->IsInterested()) {
      const char* sep = "where:\n";
      for (size_t mi = 0; mi < matches.size(); ++mi) {
        *listener << sep << " - element #" << matches[mi].first
                  << " is matched by matcher #" << matches[mi].second;
        sep = ",\n";
      }
    }
  }
  return true;
}